

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29121::TestStreamingFloatWritesCorrectCharacters::RunImpl
          (TestStreamingFloatWritesCorrectCharacters *this)

{
  TestResults *this_00;
  char *pcVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  MemoryOutStream stream;
  TestDetails local_1c0;
  undefined1 local_1a0 [408];
  
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a0);
  std::ostream::_M_insert<double>(3.1414999961853027);
  pcVar1 = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a0);
  pcVar1 = strstr(pcVar1,"3.1415");
  if (pcVar1 == (char *)0x0) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1c0,*ppTVar3,0x40);
    UnitTest::TestResults::OnTestFailure(this_00,&local_1c0,"strstr(stream.GetText(), \"3.1415\")");
  }
  UnitTest::MemoryOutStream::~MemoryOutStream
            ((MemoryOutStream *)local_1a0,&UnitTest::MemoryOutStream::VTT);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x90));
  return;
}

Assistant:

TEST(StreamingFloatWritesCorrectCharacters)
{
    MemoryOutStream stream;
    stream << 3.1415f;
	CHECK(strstr(stream.GetText(), "3.1415"));
}